

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WindowImplX11.cpp
# Opt level: O0

void __thiscall sf::priv::WindowImplX11::requestFocus(WindowImplX11 *this)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  reference ppWVar4;
  ostream *poVar5;
  ulong *puVar6;
  Mutex *in_RDI;
  XWMHints *hints;
  bool windowViewable;
  XWindowAttributes attributes;
  WindowImplX11 *in_stack_000000c0;
  iterator itr;
  Lock lock;
  bool sfmlWindowFocused;
  vector<sf::priv::WindowImplX11_*,_std::allocator<sf::priv::WindowImplX11_*>_>
  *in_stack_ffffffffffffff18;
  undefined7 in_stack_ffffffffffffff20;
  undefined1 in_stack_ffffffffffffff27;
  Lock *in_stack_ffffffffffffff30;
  undefined1 local_c0 [92];
  int local_64;
  WindowImplX11 **local_28;
  __normal_iterator<sf::priv::WindowImplX11_**,_std::vector<sf::priv::WindowImplX11_*,_std::allocator<sf::priv::WindowImplX11_*>_>_>
  local_20 [2];
  byte local_9;
  
  local_9 = 0;
  Lock::Lock(in_stack_ffffffffffffff30,in_RDI);
  local_20[0]._M_current =
       (WindowImplX11 **)
       std::vector<sf::priv::WindowImplX11_*,_std::allocator<sf::priv::WindowImplX11_*>_>::begin
                 (in_stack_ffffffffffffff18);
  do {
    local_28 = (WindowImplX11 **)
               std::vector<sf::priv::WindowImplX11_*,_std::allocator<sf::priv::WindowImplX11_*>_>::
               end(in_stack_ffffffffffffff18);
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<sf::priv::WindowImplX11_**,_std::vector<sf::priv::WindowImplX11_*,_std::allocator<sf::priv::WindowImplX11_*>_>_>
                        *)CONCAT17(in_stack_ffffffffffffff27,in_stack_ffffffffffffff20),
                       (__normal_iterator<sf::priv::WindowImplX11_**,_std::vector<sf::priv::WindowImplX11_*,_std::allocator<sf::priv::WindowImplX11_*>_>_>
                        *)in_stack_ffffffffffffff18);
    if (!bVar1) {
LAB_0031d228:
      Lock::~Lock((Lock *)CONCAT17(in_stack_ffffffffffffff27,in_stack_ffffffffffffff20));
      iVar3 = XGetWindowAttributes(in_RDI[0x7a].m_mutexImpl,in_RDI[0x79].m_mutexImpl,local_c0);
      if (iVar3 == 0) {
        poVar5 = err();
        poVar5 = std::operator<<(poVar5,
                                 "Failed to check if window is viewable while requesting focus");
        std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
      }
      else if (((local_9 & 1) == 0) || (local_64 != 2)) {
        puVar6 = (ulong *)XGetWMHints(in_RDI[0x7a].m_mutexImpl,in_RDI[0x79].m_mutexImpl);
        if (puVar6 == (ulong *)0x0) {
          puVar6 = (ulong *)XAllocWMHints();
        }
        *puVar6 = *puVar6 | 0x100;
        XSetWMHints(in_RDI[0x7a].m_mutexImpl,in_RDI[0x79].m_mutexImpl,puVar6);
        XFree(puVar6);
      }
      else {
        grabFocus(in_stack_000000c0);
      }
      return;
    }
    ppWVar4 = __gnu_cxx::
              __normal_iterator<sf::priv::WindowImplX11_**,_std::vector<sf::priv::WindowImplX11_*,_std::allocator<sf::priv::WindowImplX11_*>_>_>
              ::operator*(local_20);
    uVar2 = (*((*ppWVar4)->super_WindowImpl)._vptr_WindowImpl[0xf])();
    in_stack_ffffffffffffff27 = (undefined1)uVar2;
    if ((uVar2 & 1) != 0) {
      local_9 = 1;
      goto LAB_0031d228;
    }
    __gnu_cxx::
    __normal_iterator<sf::priv::WindowImplX11_**,_std::vector<sf::priv::WindowImplX11_*,_std::allocator<sf::priv::WindowImplX11_*>_>_>
    ::operator++(local_20);
  } while( true );
}

Assistant:

void WindowImplX11::requestFocus()
{
    using namespace WindowsImplX11Impl;

    // Focus is only stolen among SFML windows, not between applications
    // Check the global list of windows to find out whether an SFML window has the focus
    // Note: can't handle console and other non-SFML windows belonging to the application.
    bool sfmlWindowFocused = false;

    {
        Lock lock(allWindowsMutex);
        for (std::vector<WindowImplX11*>::iterator itr = allWindows.begin(); itr != allWindows.end(); ++itr)
        {
            if ((*itr)->hasFocus())
            {
                sfmlWindowFocused = true;
                break;
            }
        }
    }

    // Check if window is viewable (not on other desktop, ...)
    // TODO: Check also if minimized
    XWindowAttributes attributes;
    if (XGetWindowAttributes(m_display, m_window, &attributes) == 0)
    {
        sf::err() << "Failed to check if window is viewable while requesting focus" << std::endl;
        return; // error getting attribute
    }

    bool windowViewable = (attributes.map_state == IsViewable);

    if (sfmlWindowFocused && windowViewable)
    {
        // Another SFML window of this application has the focus and the current window is viewable:
        // steal focus (i.e. bring window to the front and give it input focus)
        grabFocus();
    }
    else
    {
        // Otherwise: display urgency hint (flashing application logo)
        // Ensure WM hints exist, allocate if necessary
        XWMHints* hints = XGetWMHints(m_display, m_window);
        if (hints == NULL)
            hints = XAllocWMHints();

        // Add urgency (notification) flag to hints
        hints->flags |= XUrgencyHint;
        XSetWMHints(m_display, m_window, hints);
        XFree(hints);
    }
}